

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O2

DH * DSA_dup_DH(DSA *r)

{
  int iVar1;
  DH *pDVar2;
  BIGNUM *pBVar3;
  pointer __p;
  UniquePtr<DH> ret;
  _Head_base<0UL,_dh_st_*,_false> local_18;
  
  if (r == (DSA *)0x0) {
    return (DH *)0x0;
  }
  pDVar2 = DH_new();
  local_18._M_head_impl = (dh_st *)pDVar2;
  if (pDVar2 == (DH *)0x0) {
LAB_003e7398:
    pDVar2 = (DH *)0x0;
  }
  else {
    if ((BIGNUM *)r->version != (BIGNUM *)0x0) {
      iVar1 = BN_num_bits((BIGNUM *)r->version);
      *(int *)&pDVar2->priv_key = iVar1;
      pBVar3 = BN_dup((BIGNUM *)r->version);
      pDVar2->g = pBVar3;
      if (pBVar3 == (BIGNUM *)0x0) goto LAB_003e7398;
    }
    if (*(BIGNUM **)r != (BIGNUM *)0x0) {
      pBVar3 = BN_dup(*(BIGNUM **)r);
      *(BIGNUM **)&pDVar2->pad = pBVar3;
      if (pBVar3 == (BIGNUM *)0x0) goto LAB_003e7398;
    }
    if (*(BIGNUM **)&r->write_params != (BIGNUM *)0x0) {
      pBVar3 = BN_dup(*(BIGNUM **)&r->write_params);
      pDVar2->p = pBVar3;
      if (pBVar3 == (BIGNUM *)0x0) goto LAB_003e7398;
    }
    if (r->p != (BIGNUM *)0x0) {
      pBVar3 = BN_dup(r->p);
      pDVar2->length = (long)pBVar3;
      if (pBVar3 == (BIGNUM *)0x0) goto LAB_003e7398;
    }
    if (r->q != (BIGNUM *)0x0) {
      pBVar3 = BN_dup(r->q);
      pDVar2->pub_key = pBVar3;
      if (pBVar3 == (BIGNUM *)0x0) goto LAB_003e7398;
    }
    local_18._M_head_impl = (dh_st *)0x0;
  }
  std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&local_18);
  return pDVar2;
}

Assistant:

DH *DSA_dup_DH(const DSA *dsa) {
  if (dsa == nullptr) {
    return nullptr;
  }

  bssl::UniquePtr<DH> ret(DH_new());
  if (ret == nullptr) {
    return nullptr;
  }
  if (dsa->q != nullptr) {
    ret->priv_length = BN_num_bits(dsa->q);
    if ((ret->q = BN_dup(dsa->q)) == nullptr) {
      return nullptr;
    }
  }
  if ((dsa->p != nullptr && (ret->p = BN_dup(dsa->p)) == nullptr) ||
      (dsa->g != nullptr && (ret->g = BN_dup(dsa->g)) == nullptr) ||
      (dsa->pub_key != nullptr &&
       (ret->pub_key = BN_dup(dsa->pub_key)) == nullptr) ||
      (dsa->priv_key != nullptr &&
       (ret->priv_key = BN_dup(dsa->priv_key)) == nullptr)) {
    return nullptr;
  }

  return ret.release();
}